

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O1

void __thiscall layer::Convolution2D::propagate(Convolution2D *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  tensor ppplVar9;
  tensor *pppplVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  longdouble lVar13;
  longdouble *plVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  Convolution2D *pCVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  longdouble in_ST0;
  longdouble lVar25;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  undefined6 in_stack_ffffffffffffff82;
  int local_58;
  int local_50;
  
  if (0 < (this->super_Layer)._sizeZOut) {
    lVar22 = 0;
    pCVar19 = this;
    do {
      if (0 < (this->super_Layer)._sizeYOut) {
        lVar24 = 0;
        do {
          if (0 < (this->super_Layer)._sizeXOut) {
            lVar16 = 0;
            lVar25 = in_ST1;
            lVar13 = in_ST3;
            do {
              in_ST3 = in_ST5;
              in_ST1 = lVar13;
              plVar14 = (this->super_Layer)._out[lVar22][lVar24];
              plVar14[lVar16] = (longdouble)0;
              plVar14 = plVar14 + lVar16;
              lVar15 = (long)(this->super_Layer)._sizeZWeight;
              if (0 < lVar15) {
                iVar1 = this->_stepY;
                local_58 = (int)lVar24;
                iVar2 = this->_zeroPaddingY;
                uVar3 = (this->super_Layer)._sizeYWeight;
                iVar4 = this->_sizeYIn;
                lVar20 = 0;
                do {
                  if (0 < (int)uVar3) {
                    iVar5 = this->_stepX;
                    local_50 = (int)lVar16;
                    iVar6 = this->_zeroPaddingX;
                    uVar7 = (this->super_Layer)._sizeXWeight;
                    iVar8 = this->_sizeXIn;
                    uVar23 = 0;
                    uVar17 = iVar1 * local_58 - iVar2;
                    do {
                      if ((-1 < (int)uVar17 && 0 < (int)uVar7) && (int)uVar17 < iVar4) {
                        ppplVar9 = (this->super_Layer)._in;
                        pppplVar10 = (this->super_Layer)._ptrWeight;
                        lVar18 = 0;
                        uVar21 = iVar5 * local_50 - iVar6;
                        do {
                          if ((-1 < (int)uVar21) && ((int)uVar21 < iVar8)) {
                            pCVar19 = (Convolution2D *)ppplVar9[lVar20][uVar17];
                            *plVar14 = *plVar14 +
                                       *(longdouble *)
                                        (&(pCVar19->super_Layer)._vptr_Layer + (ulong)uVar21 * 2) *
                                       *(longdouble *)
                                        ((long)pppplVar10[lVar22][lVar20][uVar23] + lVar18);
                            in_ST6 = in_ST3;
                          }
                          uVar21 = uVar21 + 1;
                          lVar18 = lVar18 + 0x10;
                        } while ((ulong)uVar7 << 4 != lVar18);
                      }
                      uVar17 = uVar17 + 1;
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar3);
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 != lVar15);
              }
              auVar11._10_6_ = in_stack_ffffffffffffff82;
              auVar11._0_10_ = *plVar14;
              in_ST5 = in_ST6;
              (*(this->super_Layer)._fDerivative)((scalar *)pCVar19,(scalar)auVar11);
              (this->super_Layer)._derivative[lVar22][lVar24][lVar16] = in_ST0;
              auVar12._10_6_ = in_stack_ffffffffffffff82;
              auVar12._0_10_ = (this->super_Layer)._out[lVar22][lVar24][lVar16];
              in_ST0 = in_ST2;
              in_ST2 = in_ST4;
              in_ST4 = in_ST6;
              in_ST6 = in_ST5;
              (*(this->super_Layer)._fActivation)((scalar *)pCVar19,(scalar)auVar12);
              (this->super_Layer)._out[lVar22][lVar24][lVar16] = lVar25;
              lVar16 = lVar16 + 1;
              lVar25 = in_ST1;
              lVar13 = in_ST3;
            } while (lVar16 < (this->super_Layer)._sizeXOut);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < (this->super_Layer)._sizeYOut);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < (this->super_Layer)._sizeZOut);
  }
  return;
}

Assistant:

void Convolution2D::propagate()
    {
        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {
                    _out[posZOut][posYOut][posXOut] = 0;

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeXIn)) {
                                                  _out[posZOut][posYOut][posXOut] +=
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] *
                                                _in[posZKernel][posYIn][posXIn];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                    _derivative[posZOut][posYOut][posXOut] = _fDerivative(_out[posZOut][posYOut][posXOut]);
                    _out[posZOut][posYOut][posXOut] = _fActivation(_out[posZOut][posYOut][posXOut]);

                }
            }
        }
    }